

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset_zone.cpp
# Opt level: O2

void __thiscall
sf2cute::SFPresetZone::set_instrument
          (SFPresetZone *this,weak_ptr<sf2cute::SFInstrument> *instrument)

{
  SoundFont *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((((this->parent_preset_ != (SFPreset *)0x0) &&
       (this_00 = this->parent_preset_->parent_file_, this_00 != (SoundFont *)0x0)) &&
      (p_Var1 = (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     && (p_Var1->_M_use_count != 0)) {
    std::__shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,instrument);
    SoundFont::AddInstrument(this_00,(shared_ptr<sf2cute::SFInstrument> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  std::__weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->instrument_).
              super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>,
             &instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void SFPresetZone::set_instrument(std::weak_ptr<SFInstrument> instrument) {
  if (has_parent_file() && !instrument.expired()) {
    parent_file().AddInstrument(instrument.lock());
  }
  instrument_ = std::move(instrument);
}